

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.cpp
# Opt level: O2

int zmq::tune_tcp_socket(fd_t s_)

{
  int rc_;
  int nodelay;
  
  rc_ = setsockopt(s_,6,1,&nodelay,4);
  assert_success_or_recoverable(s_,rc_);
  return rc_;
}

Assistant:

int zmq::tune_tcp_socket (fd_t s_)
{
    //  Disable Nagle's algorithm. We are doing data batching on 0MQ level,
    //  so using Nagle wouldn't improve throughput in anyway, but it would
    //  hurt latency.
    int nodelay = 1;
    const int rc =
      setsockopt (s_, IPPROTO_TCP, TCP_NODELAY,
                  reinterpret_cast<char *> (&nodelay), sizeof (int));
    assert_success_or_recoverable (s_, rc);
    if (rc != 0)
        return rc;

#ifdef ZMQ_HAVE_OPENVMS
    //  Disable delayed acknowledgements as they hurt latency significantly.
    int nodelack = 1;
    rc = setsockopt (s_, IPPROTO_TCP, TCP_NODELACK, (char *) &nodelack,
                     sizeof (int));
    assert_success_or_recoverable (s_, rc);
#endif
    return rc;
}